

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

cmSourceGroup * __thiscall cmSourceGroup::LookupChild(cmSourceGroup *this,string *name)

{
  cmSourceGroup *pcVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  cmSourceGroup *group;
  cmSourceGroup *pcVar4;
  bool bVar5;
  
  pcVar4 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->Internal->GroupChildren).
           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 != pcVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    do {
      __n = (pcVar4->Name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar5 = true;
        }
        else {
          iVar3 = bcmp((pcVar4->Name)._M_dataplus._M_p,__s2,__n);
          bVar5 = iVar3 == 0;
        }
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        return pcVar4;
      }
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar1);
  }
  return (cmSourceGroup *)0x0;
}

Assistant:

cmSourceGroup* cmSourceGroup::LookupChild(const std::string& name)
{
  for (cmSourceGroup& group : this->Internal->GroupChildren) {
    // look if descenened is the one were looking for
    if (group.GetName() == name) {
      return (&group); // if it so return it
    }
  }

  // if no child with this name was found return NULL
  return nullptr;
}